

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void Glucose_SolveCnf(char *pFileName,Glucose_Pars *pPars)

{
  lbool lVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char *__format;
  long lVar6;
  timespec ts_1;
  SimpSolver S;
  timespec local_618;
  vec<Gluco::Lit> local_608;
  SimpSolver local_5f8;
  
  iVar2 = clock_gettime(3,(timespec *)&local_5f8);
  lVar4 = -1;
  if (-1 < iVar2) {
    lVar4 = (long)local_5f8.super_Solver._8_8_ / 1000 +
            (long)local_5f8.super_Solver._vptr_Solver * 1000000;
  }
  Gluco::SimpSolver::SimpSolver(&local_5f8);
  local_5f8.super_Solver.verbosity = pPars->verb;
  local_5f8.super_Solver.conflict_budget = -1;
  if (0 < (long)pPars->nConfls) {
    local_5f8.super_Solver.conflict_budget = (long)pPars->nConfls;
  }
  local_5f8.super_Solver.conflict_budget =
       local_5f8.super_Solver.conflict_budget + local_5f8.super_Solver.conflicts;
  Glucose_ReadDimacs(pFileName,&local_5f8);
  if (pPars->verb != 0) {
    puts("c ============================[ Problem Statistics ]=============================");
    puts("c |                                                                             |");
    printf("c |  Number of variables:  %12d                                         |\n",
           (ulong)(uint)local_5f8.super_Solver.vardata.sz);
    printf("c |  Number of clauses:    %12d                                         |\n",
           (ulong)(uint)local_5f8.super_Solver.clauses.sz);
  }
  if (pPars->pre != 0) {
    Gluco::SimpSolver::eliminate(&local_5f8,true);
    printf("c Simplication removed %d variables and %d clauses.  ",
           (ulong)(uint)local_5f8.eliminated_vars,(ulong)(uint)local_5f8.eliminated_clauses);
    iVar5 = 3;
    iVar2 = clock_gettime(3,&local_618);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_618.tv_nsec / 1000 + local_618.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","Time");
    Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar6 - lVar4) / 1000000.0,0));
  }
  local_608.data = (Lit *)0x0;
  local_608.sz = 0;
  local_608.cap = 0;
  Gluco::vec<Gluco::Lit>::copyTo(&local_608,&local_5f8.super_Solver.assumptions);
  lVar1 = Gluco::SimpSolver::solve_(&local_5f8,false,false);
  if (pPars->verb != 0) {
    iVar2 = clock_gettime(3,&local_618);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_618.tv_nsec / 1000 + local_618.tv_sec * 1000000;
    }
    glucose_print_stats(&local_5f8,lVar6 - lVar4);
  }
  pcVar3 = "INDETERMINATE";
  if (lVar1.value == '\x01') {
    pcVar3 = "UNSATISFIABLE";
  }
  __format = "SATISFIABLE";
  if (lVar1.value != '\0') {
    __format = pcVar3;
  }
  printf(__format);
  iVar5 = 3;
  iVar2 = clock_gettime(3,&local_618);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_618.tv_nsec / 1000 + local_618.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","      Time");
  Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar6 - lVar4) / 1000000.0,0));
  if (local_608.data != (Lit *)0x0) {
    local_608._8_8_ = local_608._8_8_ & 0xffffffff00000000;
    free(local_608.data);
  }
  Gluco::SimpSolver::~SimpSolver(&local_5f8);
  return;
}

Assistant:

void Glucose_SolveCnf( char * pFileName, Glucose_Pars * pPars )
{
    abctime clk = Abc_Clock();

    SimpSolver  S;
    S.verbosity = pPars->verb;
    S.setConfBudget( pPars->nConfls > 0 ? (int64_t)pPars->nConfls : -1 );

//    gzFile in = gzopen(pFilename, "rb");
//    parse_DIMACS(in, S);
//    gzclose(in);
    Glucose_ReadDimacs( pFileName, S );

    if ( pPars->verb )
    {
        printf("c ============================[ Problem Statistics ]=============================\n");
        printf("c |                                                                             |\n");
        printf("c |  Number of variables:  %12d                                         |\n", S.nVars());
        printf("c |  Number of clauses:    %12d                                         |\n", S.nClauses());
    }
    
    if ( pPars->pre ) 
    {
        S.eliminate(true);
        printf( "c Simplication removed %d variables and %d clauses.  ", S.eliminated_vars, S.eliminated_clauses );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    vec<Lit> dummy;
    lbool ret = S.solveLimited(dummy, 0);
    if ( pPars->verb ) glucose_print_stats(S, Abc_Clock() - clk);
    printf(ret == l_True ? "SATISFIABLE" : ret == l_False ? "UNSATISFIABLE" : "INDETERMINATE");
    Abc_PrintTime( 1, "      Time", Abc_Clock() - clk );
}